

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFFPdu.cpp
# Opt level: O0

void __thiscall DIS::IFFPdu::IFFPdu(IFFPdu *this)

{
  IFFPdu *this_local;
  
  DistributedEmissionsFamilyPdu::DistributedEmissionsFamilyPdu
            (&this->super_DistributedEmissionsFamilyPdu);
  (this->super_DistributedEmissionsFamilyPdu).super_Pdu.super_PduSuperclass._vptr_PduSuperclass =
       (_func_int **)&PTR__IFFPdu_00267e60;
  EntityID::EntityID(&this->_emittingEntityID);
  EventIdentifier::EventIdentifier(&this->_eventID);
  Vector3Float::Vector3Float(&this->_relativeAntennaLocation);
  this->_numberOfIFFParameters = 0;
  SystemIdentifier::SystemIdentifier(&this->_systemID);
  this->_systemDesignator = '\0';
  this->_systemSpecificData = '\0';
  FundamentalOperationalData::FundamentalOperationalData(&this->_fundamentalOperationalData);
  LayerHeader::LayerHeader(&this->_layerHeader);
  BeamData::BeamData(&this->_beamData);
  SecondaryOperationalData::SecondaryOperationalData(&this->_secondaryOperationalData);
  std::vector<DIS::IFFFundamentalParameterData,_std::allocator<DIS::IFFFundamentalParameterData>_>::
  vector(&this->_iffParameters);
  PduSuperclass::setPduType((PduSuperclass *)this,'\x1c');
  return;
}

Assistant:

IFFPdu::IFFPdu() : DistributedEmissionsFamilyPdu(),
   _emittingEntityID(), 
   _eventID(),
   _relativeAntennaLocation(),
   _numberOfIFFParameters(0),
   _systemID(),
   _systemDesignator(0),
   _systemSpecificData(0),
   _fundamentalOperationalData(),
   _layerHeader(),
   _beamData(),
   _secondaryOperationalData()
{
    setPduType( 28 );
}